

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

Iterator<int,_true,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
          (Iterator<int,_true,_std::allocator<unsigned_long>_> *this)

{
  View<int,_true,_std::allocator<unsigned_long>_> *pVVar1;
  ulong uVar2;
  unsigned_long uVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  reference piVar7;
  pointer puVar8;
  size_t sVar9;
  
  marray_detail::Assert<bool>(this->view_ != (view_pointer)0x0);
  if (this->index_ < (this->view_->geometry_).size_) {
    this->index_ = this->index_ + 1;
    bVar4 = View<int,_true,_std::allocator<unsigned_long>_>::isSimple(this->view_);
    if (bVar4) {
      this->pointer_ = this->pointer_ + 1;
    }
    else {
      pVVar1 = this->view_;
      uVar2 = (pVVar1->geometry_).size_;
      if (this->index_ < uVar2) {
        View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        puVar8 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((pVVar1->geometry_).coordinateOrder_ == LastMajorOrder) {
          for (sVar9 = 0;
              sVar9 < (ulong)((long)(this->coordinates_).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3);
              sVar9 = sVar9 + 1) {
            uVar3 = puVar8[sVar9];
            sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::shape(this->view_,sVar9);
            sVar6 = View<int,_true,_std::allocator<unsigned_long>_>::strides(this->view_,sVar9);
            if (uVar3 != sVar5 - 1) goto LAB_00112ceb;
            puVar8 = (this->coordinates_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            this->pointer_ = this->pointer_ + -(sVar6 * puVar8[sVar9]);
            puVar8[sVar9] = 0;
          }
        }
        else {
          sVar9 = (long)(this->coordinates_).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar8 >> 3;
          do {
            sVar9 = sVar9 - 1;
            uVar3 = puVar8[sVar9];
            sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::shape(this->view_,sVar9);
            sVar6 = View<int,_true,_std::allocator<unsigned_long>_>::strides(this->view_,sVar9);
            if (uVar3 != sVar5 - 1) goto LAB_00112ceb;
            puVar8 = (this->coordinates_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            this->pointer_ = this->pointer_ + -(sVar6 * puVar8[sVar9]);
            puVar8[sVar9] = 0;
          } while (sVar9 != 0);
        }
      }
      else {
        piVar7 = View<int,_true,_std::allocator<unsigned_long>_>::operator()(pVVar1,uVar2 - 1);
        this->pointer_ = piVar7 + 1;
        pVVar1 = this->view_;
        View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        if ((pVVar1->geometry_).coordinateOrder_ == LastMajorOrder) {
          puVar8 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *puVar8 = *puVar8 + 1;
        }
        else {
          sVar9 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this->view_);
          puVar8 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + (sVar9 - 1);
          *puVar8 = *puVar8 + 1;
        }
      }
    }
  }
LAB_00112bd4:
  testInvariant(this);
  return this;
LAB_00112ceb:
  this->pointer_ = this->pointer_ + sVar6;
  puVar8 = (this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + sVar9;
  *puVar8 = *puVar8 + 1;
  goto LAB_00112bd4;
}

Assistant:

inline Iterator<T, isConst, A>&
Iterator<T, isConst, A>::operator++()
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    if(index_ < view_->size()) { // view initialized and iterator not at the end
        ++index_;
        if(view_->isSimple()) {
            ++pointer_;
        }
        else {
            if(index_ < view_->size()) {
                if(view_->coordinateOrder() == LastMajorOrder) {
                    for(std::size_t j=0; j<coordinates_.size(); ++j) {
                        if(coordinates_[j] == view_->shape(j)-1) {
                            pointer_ -= view_->strides(j) * coordinates_[j];
                            coordinates_[j] = 0;
                        }
                        else {
                            pointer_ += view_->strides(j);
                            ++coordinates_[j];
                            break;
                        }
                    }
                }
                else { // FirstMajorOrder
                    std::size_t j = coordinates_.size() - 1;
                    for(;;) {
                        if(coordinates_[j] == view_->shape(j)-1) {
                            pointer_ -= view_->strides(j) * coordinates_[j];
                            coordinates_[j] = 0;
                        }
                        else {
                            pointer_ += view_->strides(j);
                            ++coordinates_[j];
                            break;
                        }
                        if(j == 0) {
                            break;
                        }
                        else {
                            --j;
                        }
                    }
                }
            }
            else {
                // set to end iterator
                pointer_ = &((*view_)(view_->size()-1)) + 1;
                if(view_->coordinateOrder() == LastMajorOrder) {
                    ++coordinates_[0];
                }
                else { // FirstMajorOrder
                    ++coordinates_[view_->dimension()-1];
                }
            }
        }
    }
    testInvariant();
    return *this;
}